

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O0

Vec_Int_t * Pla_ManComputeDistance1Int(Pla_Man_t *p)

{
  int iVar3;
  uint uVar4;
  uint i_00;
  int iVar;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *vVec;
  Vec_Int_t *p_03;
  Tab_Man_t *pTab_00;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  int iVar2;
  int iVar1;
  int iCube2;
  int iCube1;
  int k;
  int i;
  int v;
  int nBits;
  Vec_Int_t *vEntries;
  Vec_Int_t *vCounts;
  Vec_Int_t *vPairs;
  Vec_Int_t *vTemp2;
  Vec_Int_t *vTemp1;
  Vec_Int_t *vCube2;
  Vec_Int_t *vCube1;
  Tab_Man_t *pTab;
  Pla_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  p_02 = Vec_IntAlloc(1000);
  iVar3 = Vec_WecSize(&p->vCubeLits);
  vVec = Vec_IntStart(iVar3);
  p_03 = Vec_IntAlloc(p->nIns);
  uVar4 = Vec_WecSizeSize(&p->vCubeLits);
  iVar3 = Abc_Base2Log(uVar4);
  if (0x1a < iVar3 + 2) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                  ,0x115,"Vec_Int_t *Pla_ManComputeDistance1Int(Pla_Man_t *)");
  }
  pTab_00 = Tab_ManAlloc(iVar3 + 2,p);
  Pla_ManHashCubes2(p,pTab_00);
  for (k = 0; k <= pTab_00->SizeMask; k = k + 1) {
    Tab_ManHashCollect(pTab_00,k,p_03);
    for (iCube1 = 0; iVar3 = Vec_IntSize(p_03), iCube2 = iCube1, iCube1 < iVar3 / 2;
        iCube1 = iCube1 + 1) {
      while( true ) {
        iCube2 = iCube2 + 1;
        iVar3 = Vec_IntSize(p_03);
        if (iVar3 / 2 <= iCube2) break;
        uVar4 = Vec_IntEntry(p_03,iCube1 << 1);
        i_00 = Vec_IntEntry(p_03,iCube2 * 2);
        iVar3 = Vec_IntEntry(p_03,iCube1 * 2 + 1);
        iVar = Vec_IntEntry(p_03,iCube2 * 2 + 1);
        p_04 = Vec_WecEntry(&p->vCubeLits,uVar4);
        p_05 = Vec_WecEntry(&p->vCubeLits,i_00);
        iVar5 = Vec_IntSize(p_04);
        iVar6 = Vec_IntSize(p_05);
        if (iVar5 == iVar6) {
          Vec_IntCopySkip(p_04,iVar3,p_00);
          Vec_IntCopySkip(p_05,iVar,p_01);
          iVar5 = Vec_IntEqual(p_00,p_01);
          if (iVar5 != 0) {
            printf("%d %d  ",(ulong)uVar4,(ulong)i_00);
            Vec_IntPushTwo(p_02,uVar4,iVar3);
            Vec_IntPushTwo(p_02,i_00,iVar);
            Vec_IntAddToEntry(vVec,uVar4,1);
            Vec_IntAddToEntry(vVec,i_00,1);
          }
        }
      }
    }
  }
  Vec_IntPrint(vVec);
  Vec_IntFree(vVec);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_03);
  Tab_ManFree(pTab_00);
  return p_02;
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1Int( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube1, * vCube2;
    Vec_Int_t * vTemp1 = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp2 = Vec_IntAlloc( 100 );
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCounts = Vec_IntStart( Vec_WecSize(&p->vCubeLits) );
    Vec_Int_t * vEntries = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Vec_WecSizeSize(&p->vCubeLits) ) + 2;
    int v, i, k;//, Count = 0;
    int iCube1, iCube2, iVar1, iVar2;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    //Pla_ManConvertFromBits( p );
    Pla_ManHashCubes2( p, pTab );
    // iterate through the hash bins
    for ( v = 0; v <= pTab->SizeMask; v++ )
    {
        Tab_ManHashCollect( pTab, v, vEntries );
        for ( i = 0; i < Vec_IntSize(vEntries)/2; i++ )
        for ( k = i+1; k < Vec_IntSize(vEntries)/2; k++ )
        {
            iCube1 = Vec_IntEntry(vEntries, 2*i);
            iCube2 = Vec_IntEntry(vEntries, 2*k);
            iVar1 = Vec_IntEntry(vEntries, 2*i+1);
            iVar2 = Vec_IntEntry(vEntries, 2*k+1);

            vCube1 = Vec_WecEntry(&p->vCubeLits, iCube1);
            vCube2 = Vec_WecEntry(&p->vCubeLits, iCube2);
/*
            Pla_PrintCube( vCube1, p->nIns, iVar1 );
            Pla_PrintCube( vCube2, p->nIns, iVar2 );
            printf( "\n" );
*/
            if ( Vec_IntSize(vCube1) != Vec_IntSize(vCube2) )
                continue;
            Vec_IntCopySkip( vCube1, iVar1, vTemp1 );
            Vec_IntCopySkip( vCube2, iVar2, vTemp2 );
            if ( !Vec_IntEqual( vTemp1, vTemp2 ) )
                continue;

            printf( "%d %d  ", iCube1, iCube2 );

            Vec_IntPushTwo( vPairs, iCube1, iVar1 );
            Vec_IntPushTwo( vPairs, iCube2, iVar2 );

            Vec_IntAddToEntry( vCounts, iCube1, 1 );
            Vec_IntAddToEntry( vCounts, iCube2, 1 );
        }
    }
    Vec_IntPrint( vCounts );

    Vec_IntFree( vCounts );
    Vec_IntFree( vTemp1 );
    Vec_IntFree( vTemp2 );
    Vec_IntFree( vEntries );
    Tab_ManFree( pTab );
    return vPairs;
}